

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryDirectory::replaceFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  ArrayDisposer **ppAVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  AtomicRefcounted *refcounted;
  _func_int **pp_Var5;
  undefined4 in_register_0000000c;
  size_t sVar6;
  undefined8 *puVar7;
  char *pcVar8;
  Replacer<kj::File> *extraout_RDX;
  Replacer<kj::File> *extraout_RDX_00;
  Replacer<kj::File> *pRVar9;
  kj *this_00;
  undefined4 in_R8D;
  StringPtr name;
  Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> OVar10;
  StringPtr value;
  undefined1 local_58 [16];
  Fault f;
  
  sVar6 = CONCAT44(in_register_0000000c,mode);
  puVar7 = (undefined8 *)path.parts.size_;
  name.content.ptr = path.parts.ptr;
  if (sVar6 == 1) {
    puVar2 = (undefined8 *)name.content.ptr[2].content.size_;
    (**(code **)*puVar2)(local_58,puVar2,name.content.ptr[2].content.ptr);
    pp_Var5 = (_func_int **)operator_new(0x48);
    uVar4 = local_58._8_8_;
    lVar3 = puVar7[1];
    if (lVar3 == 0) {
      this_00 = (kj *)0x1e847a;
    }
    else {
      this_00 = (kj *)*puVar7;
    }
    value.content.ptr = (char *)(lVar3 + (ulong)(lVar3 == 0));
    f.exception = (Exception *)local_58._0_8_;
    local_58._8_8_ = (_func_int **)0x0;
    *(undefined4 *)(pp_Var5 + 1) = in_R8D;
    *pp_Var5 = (_func_int *)&PTR_get_002600f0;
    *(undefined1 *)((long)pp_Var5 + 0xc) = 0;
    LOCK();
    ppAVar1 = &((name.content.ptr)->content).disposer;
    *(int *)ppAVar1 = *(int *)ppAVar1 + 1;
    UNLOCK();
    pp_Var5[2] = (_func_int *)&((name.content.ptr)->content).size_;
    pp_Var5[3] = (_func_int *)name.content.ptr;
    value.content.size_ = sVar6;
    heapString((String *)(pp_Var5 + 4),this_00,value);
    pp_Var5[7] = (_func_int *)local_58._0_8_;
    pp_Var5[8] = (_func_int *)uVar4;
    Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&f);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var5;
  }
  else {
    if (sVar6 == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x48b,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      _::Debug::Fault::~Fault(&f);
    }
    else {
      lVar3 = puVar7[1];
      if (lVar3 == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = (char *)*puVar7;
      }
      name.content.size_ = (size_t)pcVar8;
      tryGetParent((InMemoryDirectory *)local_58,name,(int)lVar3 + (uint)(lVar3 == 0));
      uVar4 = local_58._8_8_;
      f.exception = (Exception *)local_58._0_8_;
      local_58._8_8_ = (_func_int **)0x0;
      Own<const_kj::Directory,_std::nullptr_t>::dispose
                ((Own<const_kj::Directory,_std::nullptr_t> *)local_58);
      if ((_func_int **)uVar4 != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)uVar4 + 0x70))(this,uVar4,puVar7 + 3,sVar6 - 1,in_R8D);
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&f);
        pRVar9 = extraout_RDX;
        goto LAB_001d7610;
      }
      Own<const_kj::Directory,_std::nullptr_t>::dispose
                ((Own<const_kj::Directory,_std::nullptr_t> *)&f);
    }
    puVar7 = (undefined8 *)name.content.ptr[2].content.size_;
    (**(code **)*puVar7)(local_58,puVar7,name.content.ptr[2].content.ptr);
    pp_Var5 = (_func_int **)operator_new(0x20);
    uVar4 = local_58._8_8_;
    f.exception = (Exception *)local_58._0_8_;
    local_58._8_8_ = (_func_int **)0x0;
    *(undefined4 *)(pp_Var5 + 1) = 3;
    *pp_Var5 = (_func_int *)&PTR_get_00260160;
    ((FsNode *)(pp_Var5 + 2))->_vptr_FsNode = (_func_int **)local_58._0_8_;
    pp_Var5[3] = (_func_int *)uVar4;
    Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&f);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var5;
  }
  Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)local_58);
  pRVar9 = extraout_RDX_00;
LAB_001d7610:
  OVar10.ptr = pRVar9;
  OVar10.disposer = (Disposer *)this;
  return OVar10;
}

Assistant:

Own<Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
    } else if (path.size() == 1) {
      // don't need lock just to construct a file
      return heap<ReplacerImpl<File>>(*this, path[0],
          impl.getWithoutLock().newFile(), mode);
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], mode)) {
        return child->replaceFile(path.slice(1, path.size()), mode);
      }
    }
    return heap<BrokenReplacer<File>>(impl.getWithoutLock().newFile());
  }